

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fast_div_generator.cpp
# Opt level: O0

void generate<short>(style gen_style)

{
  int in_EDI;
  _func_void_short **in_stack_ffffffffffffff88;
  uint in_stack_ffffffffffffff90;
  _func_void_short *local_28 [5];
  
  if (in_EDI == 0) {
    std::function<void(short)>::function<void(*)(short),void>
              ((function<void_(short)> *)(ulong)in_stack_ffffffffffffff90,local_28);
    generator<short>((function<void_(short)> *)CONCAT44(in_EDI,in_stack_ffffffffffffff90));
    std::function<void_(short)>::~function((function<void_(short)> *)0x103462);
  }
  else if (in_EDI == 1) {
    std::function<void(short)>::function<void(*)(short),void>
              ((function<void_(short)> *)CONCAT44(1,in_stack_ffffffffffffff90),
               in_stack_ffffffffffffff88);
    generator<short>((function<void_(short)> *)CONCAT44(in_EDI,in_stack_ffffffffffffff90));
    std::function<void_(short)>::~function((function<void_(short)> *)0x1034b4);
  }
  else if (in_EDI == 2) {
    generate_const_func<short>();
  }
  return;
}

Assistant:

void generate(style gen_style) {
    switch (gen_style)
    {
    case style::macro:
        generator<_IntT>(&generate_constant_macro<_IntT>);
        break;
    case style::cpp_template:
        generator<_IntT>(&generate_specialized_template<_IntT>);
        break;
    
    case style::const_func:
        generate_const_func<_IntT>();
        break;

    default:
        break;
    }
}